

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void av1_fill_coeff_costs(CoeffCosts *coeff_costs,FRAME_CONTEXT *fc,int num_planes)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  aom_cdf_prob (*paaaVar4) [2] [12];
  int *piVar5;
  int ctx_2;
  int iVar6;
  aom_cdf_prob (*paaaaVar7) [2] [4] [4];
  aom_cdf_prob (*paaaaVar8) [2] [42] [5];
  int (*paiVar9) [26];
  int ctx;
  long lVar10;
  int (*paiVar11) [26];
  int plane_1;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  aom_cdf_prob *cdf;
  aom_cdf_prob (*paaaaVar15) [2] [9] [3];
  int (*paiVar16) [26];
  int *piVar17;
  int *piVar18;
  int ctx_1;
  long lVar19;
  CoeffCosts *costs;
  aom_cdf_prob (*cdf_00) [2] [4] [4];
  aom_cdf_prob (*cdf_01) [2] [42] [5];
  aom_cdf_prob (*cdf_02) [2] [9] [3];
  aom_cdf_prob (*cdf_03) [3] [3];
  int plane;
  ulong uVar20;
  ulong uVar21;
  CoeffCosts *pCVar22;
  CoeffCosts *pCVar23;
  LV_MAP_EOB_COST *pLVar24;
  LV_MAP_EOB_COST *pLVar25;
  LV_MAP_EOB_COST *costs_00;
  aom_cdf_prob (*local_e0) [2] [4] [4];
  aom_cdf_prob (*local_d8) [2] [42] [5];
  aom_cdf_prob (*local_d0) [2] [9] [3];
  aom_cdf_prob (*local_c8) [3] [3];
  int (*local_c0) [26];
  aom_cdf_prob (*local_b8) [2] [6];
  FRAME_CONTEXT *local_90;
  int br_rate [4];
  
  uVar2 = 2;
  if (num_planes < 2) {
    uVar2 = num_planes;
  }
  pLVar24 = coeff_costs->eob_costs[0];
  uVar12 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar12;
  }
  do {
    if (uVar12 == 7) {
      paaaaVar7 = fc->coeff_base_eob_cdf;
      paaaaVar8 = fc->coeff_base_cdf;
      paaaaVar15 = fc->eob_extra_cdf;
      paiVar16 = coeff_costs->coeff_costs[0][0].lps_cost;
      piVar17 = coeff_costs->coeff_costs[0][0].lps_cost[0] + 0xe;
      pCVar22 = coeff_costs;
      local_90 = fc;
      for (uVar12 = 0; uVar12 != 5; uVar12 = uVar12 + 1) {
        uVar20 = 3;
        if ((uint)uVar12 < 3) {
          uVar20 = uVar12;
        }
        piVar18 = piVar17;
        pCVar23 = pCVar22;
        local_e0 = paaaaVar7;
        local_d8 = paaaaVar8;
        local_d0 = paaaaVar15;
        local_c8 = fc->dc_sign_cdf;
        local_c0 = paiVar16;
        for (uVar13 = 0; uVar13 != uVar3; uVar13 = uVar13 + 1) {
          costs = pCVar23;
          for (lVar10 = 0; lVar10 != 0x4e; lVar10 = lVar10 + 6) {
            av1_cost_tokens_from_cdf
                      ((int *)costs,(aom_cdf_prob *)((long)local_90->txb_skip_cdf[0][0] + lVar10),
                       (int *)0x0);
            costs = (CoeffCosts *)(costs->coeff_costs[0][0].txb_skip_cost + 1);
          }
          cdf_00 = local_e0;
          for (lVar10 = 0x68; lVar10 != 0x98; lVar10 = lVar10 + 0xc) {
            av1_cost_tokens_from_cdf
                      ((int *)((long)pCVar23->coeff_costs[0][0].txb_skip_cost[0] + lVar10),
                       (aom_cdf_prob *)cdf_00,(int *)0x0);
            cdf_00 = (aom_cdf_prob (*) [2] [4] [4])((*cdf_00)[0] + 1);
          }
          cdf_01 = local_d8;
          for (lVar10 = 0x98; lVar10 != 0x5d8; lVar10 = lVar10 + 0x20) {
            av1_cost_tokens_from_cdf
                      ((int *)((long)pCVar23->coeff_costs[0][0].txb_skip_cost[0] + lVar10),
                       (aom_cdf_prob *)cdf_01,(int *)0x0);
            cdf_01 = (aom_cdf_prob (*) [2] [42] [5])((*cdf_01)[0] + 1);
          }
          for (lVar10 = 0xb4; lVar10 != 0x5f4; lVar10 = lVar10 + 0x20) {
            *(undefined4 *)((long)(pCVar23->coeff_costs + -1) + 0x1d74 + lVar10) = 0;
            iVar6 = *(int *)((long)(pCVar23->coeff_costs + -1) + 0x1d68 + lVar10);
            iVar1 = *(int *)((long)(pCVar23->coeff_costs + -1) + 0x1d6c + lVar10);
            *(int *)((long)(pCVar23->coeff_costs + -1) + 0x1d78 + lVar10) =
                 (iVar6 - *(int *)((long)(pCVar23->coeff_costs + -1) + 0x1d64 + lVar10)) + 0x200;
            *(int *)((long)(pCVar23->coeff_costs + -1) + 0x1d7c + lVar10) = iVar1 - iVar6;
            *(int *)((long)pCVar23->coeff_costs[0][0].txb_skip_cost[0] + lVar10) =
                 *(int *)((long)(pCVar23->coeff_costs + -1) + 0x1d70 + lVar10) - iVar1;
          }
          cdf_02 = local_d0;
          for (lVar10 = 0x5d8; lVar10 != 0x620; lVar10 = lVar10 + 8) {
            av1_cost_tokens_from_cdf
                      ((int *)((long)pCVar23->coeff_costs[0][0].txb_skip_cost[0] + lVar10),
                       (aom_cdf_prob *)cdf_02,(int *)0x0);
            cdf_02 = (aom_cdf_prob (*) [2] [9] [3])((*cdf_02)[0] + 1);
          }
          cdf_03 = local_c8;
          for (lVar10 = 0x620; lVar10 != 0x638; lVar10 = lVar10 + 8) {
            av1_cost_tokens_from_cdf
                      ((int *)((long)pCVar23->coeff_costs[0][0].txb_skip_cost[0] + lVar10),
                       (aom_cdf_prob *)cdf_03,(int *)0x0);
            cdf_03 = (aom_cdf_prob (*) [3] [3])(*cdf_03 + 1);
          }
          paiVar11 = local_c0;
          for (lVar10 = 0; lVar10 != 0x15; lVar10 = lVar10 + 1) {
            av1_cost_tokens_from_cdf
                      (br_rate,fc->coeff_br_cdf[uVar20 & 0xffffffff][uVar13][lVar10],(int *)0x0);
            iVar6 = 0;
            paiVar9 = paiVar11;
            for (uVar21 = 0; uVar21 < 0xc; uVar21 = uVar21 + 3) {
              for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
                (*paiVar9)[lVar19] = br_rate[lVar19] + iVar6;
              }
              iVar6 = iVar6 + br_rate[3];
              paiVar9 = (int (*) [26])(*paiVar9 + 3);
            }
            coeff_costs->coeff_costs[uVar12][uVar13].lps_cost[lVar10][0xc] = iVar6;
            paiVar11 = paiVar11 + 1;
          }
          piVar5 = piVar18;
          for (lVar10 = 0; lVar10 != 0x15; lVar10 = lVar10 + 1) {
            coeff_costs->coeff_costs[uVar12][uVar13].lps_cost[lVar10][0xd] =
                 coeff_costs->coeff_costs[uVar12][uVar13].lps_cost[lVar10][0];
            for (lVar19 = -0x30; lVar19 != 0; lVar19 = lVar19 + 4) {
              *(int *)((long)piVar5 + lVar19 + 0x30) =
                   *(int *)((long)piVar5 + lVar19 + -4) - *(int *)((long)piVar5 + lVar19 + -8);
            }
            piVar5 = piVar5 + 0x1a;
          }
          pCVar23 = (CoeffCosts *)(pCVar23->coeff_costs[0] + 1);
          local_e0 = (aom_cdf_prob (*) [2] [4] [4])(*local_e0 + 1);
          local_d8 = (aom_cdf_prob (*) [2] [42] [5])(*local_d8 + 1);
          local_d0 = (aom_cdf_prob (*) [2] [9] [3])(*local_d0 + 1);
          local_c8 = local_c8 + 1;
          local_c0 = (int (*) [26])((long)(local_c0 + 0x24) + 0x20);
          piVar18 = piVar18 + 0x3b0;
        }
        pCVar22 = (CoeffCosts *)(pCVar22->coeff_costs + 1);
        local_90 = (FRAME_CONTEXT *)(local_90->txb_skip_cdf + 1);
        paaaaVar7 = paaaaVar7 + 1;
        paaaaVar8 = paaaaVar8 + 1;
        paaaaVar15 = paaaaVar15 + 1;
        paiVar16 = (int (*) [26])((long)(paiVar16 + 0x48) + 0x40);
        piVar17 = piVar17 + 0x760;
      }
      return;
    }
    pLVar25 = pLVar24;
    local_b8 = fc->eob_flag_cdf16;
    for (uVar20 = 0; uVar20 != uVar3; uVar20 = uVar20 + 1) {
      lVar10 = 0;
      costs_00 = pLVar25;
      for (lVar19 = 0; lVar19 != 0x18; lVar19 = lVar19 + 0xc) {
        switch(uVar12 & 0xffffffff) {
        case 0:
          cdf = (aom_cdf_prob *)((long)(*local_b8)[0] + lVar19);
          goto LAB_001e6ee4;
        case 1:
          paaaVar4 = (aom_cdf_prob (*) [2] [12])(fc->eob_flag_cdf32 + uVar20);
          lVar14 = lVar10 * 0xe;
          break;
        case 2:
          paaaVar4 = (aom_cdf_prob (*) [2] [12])(fc->eob_flag_cdf64 + uVar20);
          lVar14 = lVar10 << 4;
          break;
        case 3:
          paaaVar4 = (aom_cdf_prob (*) [2] [12])(fc->eob_flag_cdf128 + uVar20);
          lVar14 = lVar10 * 0x12;
          break;
        case 4:
          paaaVar4 = (aom_cdf_prob (*) [2] [12])(fc->eob_flag_cdf256 + uVar20);
          lVar14 = lVar10 * 0x14;
          break;
        case 5:
          paaaVar4 = (aom_cdf_prob (*) [2] [12])(fc->eob_flag_cdf512 + uVar20);
          lVar14 = lVar10 * 0x16;
          break;
        default:
          paaaVar4 = fc->eob_flag_cdf1024 + uVar20;
          lVar14 = lVar10 * 0x18;
        }
        cdf = (aom_cdf_prob *)((long)(*paaaVar4)[0] + lVar14);
LAB_001e6ee4:
        av1_cost_tokens_from_cdf((int *)costs_00,cdf,(int *)0x0);
        lVar10 = lVar10 + 1;
        costs_00 = (LV_MAP_EOB_COST *)(((LV_MAP_EOB_COST *)costs_00->eob_cost)->eob_cost + 1);
      }
      local_b8 = local_b8 + 1;
      pLVar25 = pLVar25 + 1;
    }
    uVar12 = uVar12 + 1;
    pLVar24 = pLVar24 + 2;
  } while( true );
}

Assistant:

void av1_fill_coeff_costs(CoeffCosts *coeff_costs, FRAME_CONTEXT *fc,
                          const int num_planes) {
  const int nplanes = AOMMIN(num_planes, PLANE_TYPES);
  for (int eob_multi_size = 0; eob_multi_size < 7; ++eob_multi_size) {
    for (int plane = 0; plane < nplanes; ++plane) {
      LV_MAP_EOB_COST *pcost = &coeff_costs->eob_costs[eob_multi_size][plane];

      for (int ctx = 0; ctx < 2; ++ctx) {
        aom_cdf_prob *pcdf;
        switch (eob_multi_size) {
          case 0: pcdf = fc->eob_flag_cdf16[plane][ctx]; break;
          case 1: pcdf = fc->eob_flag_cdf32[plane][ctx]; break;
          case 2: pcdf = fc->eob_flag_cdf64[plane][ctx]; break;
          case 3: pcdf = fc->eob_flag_cdf128[plane][ctx]; break;
          case 4: pcdf = fc->eob_flag_cdf256[plane][ctx]; break;
          case 5: pcdf = fc->eob_flag_cdf512[plane][ctx]; break;
          case 6:
          default: pcdf = fc->eob_flag_cdf1024[plane][ctx]; break;
        }
        av1_cost_tokens_from_cdf(pcost->eob_cost[ctx], pcdf, NULL);
      }
    }
  }
  for (int tx_size = 0; tx_size < TX_SIZES; ++tx_size) {
    for (int plane = 0; plane < nplanes; ++plane) {
      LV_MAP_COEFF_COST *pcost = &coeff_costs->coeff_costs[tx_size][plane];

      for (int ctx = 0; ctx < TXB_SKIP_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->txb_skip_cost[ctx],
                                 fc->txb_skip_cdf[tx_size][ctx], NULL);

      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS_EOB; ++ctx)
        av1_cost_tokens_from_cdf(pcost->base_eob_cost[ctx],
                                 fc->coeff_base_eob_cdf[tx_size][plane][ctx],
                                 NULL);
      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->base_cost[ctx],
                                 fc->coeff_base_cdf[tx_size][plane][ctx], NULL);

      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS; ++ctx) {
        pcost->base_cost[ctx][4] = 0;
        pcost->base_cost[ctx][5] = pcost->base_cost[ctx][1] +
                                   av1_cost_literal(1) -
                                   pcost->base_cost[ctx][0];
        pcost->base_cost[ctx][6] =
            pcost->base_cost[ctx][2] - pcost->base_cost[ctx][1];
        pcost->base_cost[ctx][7] =
            pcost->base_cost[ctx][3] - pcost->base_cost[ctx][2];
      }

      for (int ctx = 0; ctx < EOB_COEF_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->eob_extra_cost[ctx],
                                 fc->eob_extra_cdf[tx_size][plane][ctx], NULL);

      for (int ctx = 0; ctx < DC_SIGN_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->dc_sign_cost[ctx],
                                 fc->dc_sign_cdf[plane][ctx], NULL);

      for (int ctx = 0; ctx < LEVEL_CONTEXTS; ++ctx) {
        int br_rate[BR_CDF_SIZE];
        int prev_cost = 0;
        int i, j;
        av1_cost_tokens_from_cdf(
            br_rate, fc->coeff_br_cdf[AOMMIN(tx_size, TX_32X32)][plane][ctx],
            NULL);
        for (i = 0; i < COEFF_BASE_RANGE; i += BR_CDF_SIZE - 1) {
          for (j = 0; j < BR_CDF_SIZE - 1; j++) {
            pcost->lps_cost[ctx][i + j] = prev_cost + br_rate[j];
          }
          prev_cost += br_rate[j];
        }
        pcost->lps_cost[ctx][i] = prev_cost;
      }
      for (int ctx = 0; ctx < LEVEL_CONTEXTS; ++ctx) {
        pcost->lps_cost[ctx][0 + COEFF_BASE_RANGE + 1] =
            pcost->lps_cost[ctx][0];
        for (int i = 1; i <= COEFF_BASE_RANGE; ++i) {
          pcost->lps_cost[ctx][i + COEFF_BASE_RANGE + 1] =
              pcost->lps_cost[ctx][i] - pcost->lps_cost[ctx][i - 1];
        }
      }
    }
  }
}